

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc4.cc
# Opt level: O2

void RC4(RC4_KEY *key,size_t len,uchar *indata,uchar *outdata)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i;
  size_t sVar5;
  
  uVar3 = (ulong)key->x;
  uVar4 = (ulong)key->y;
  sVar5 = 0;
  while( true ) {
    if (len == sVar5) break;
    uVar3 = (ulong)((uint)uVar3 + 1 & 0xff);
    uVar1 = key->data[uVar3];
    uVar4 = (ulong)((uint)uVar4 + uVar1 & 0xff);
    uVar2 = key->data[uVar4];
    key->data[uVar3] = uVar2;
    key->data[uVar4] = uVar1;
    outdata[sVar5] = indata[sVar5] ^ (byte)key->data[uVar2 + uVar1 & 0xff];
    sVar5 = sVar5 + 1;
  }
  key->x = (uint)uVar3;
  key->y = (uint)uVar4;
  return;
}

Assistant:

void RC4(RC4_KEY *key, size_t len, const uint8_t *in, uint8_t *out) {
  uint32_t x = key->x;
  uint32_t y = key->y;
  uint32_t *d = key->data;

  for (size_t i = 0; i < len; i++) {
    x = (x + 1) & 0xff;
    uint32_t tx = d[x];
    y = (tx + y) & 0xff;
    uint32_t ty = d[y];
    d[x] = ty;
    d[y] = tx;
    out[i] = d[(tx + ty) & 0xff] ^ in[i];
  }

  key->x = x;
  key->y = y;
}